

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O0

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,LambdaCallNode *node)

{
  bool bVar1;
  __optional_ne_t<TypeName,_TypeName> _Var2;
  LambdaNode *this_00;
  string *message;
  Node *pNVar3;
  element_type *peVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  mapped_type *__rhs;
  long *in_RSI;
  char *in_RDI;
  TypeChecker typeChecker;
  shared_ptr<ExpressionNode> *arg;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *__range1
  ;
  const_iterator expectedArgumentIt;
  size_type nProvidedArgs;
  size_type nExpectedArgs;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  *providedArguments;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *expectedArguments;
  LambdaNode *lambda;
  SymbolTable *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  TypeChecker local_148;
  reference local_130;
  _Self local_128;
  _Self local_120;
  Node *local_118;
  _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
  local_110 [27];
  size_type local_38;
  size_type local_30;
  
  this_00 = LambdaCallNode::getLambda((LambdaCallNode *)0x17b461);
  message = (string *)LambdaNode::getArguments_abi_cxx11_(this_00);
  pNVar3 = (Node *)(**(code **)(*in_RSI + 0x18))();
  local_30 = std::__cxx11::
             list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
             ::size((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                     *)in_stack_fffffffffffffde0);
  local_38 = std::__cxx11::
             list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
             ::size((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                     *)in_stack_fffffffffffffde0);
  (*(this_00->super_ExpressionNode).super_Node._vptr_Node[2])(this_00,in_RDI);
  if (local_30 != local_38) {
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffe18);
    std::operator+((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffe18);
    std::operator+(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
    reportError(message,pNVar3);
  }
  local_118 = pNVar3;
  local_110[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
       ::begin((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                *)in_stack_fffffffffffffdd8);
  pNVar3 = local_118;
  local_120._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
       begin((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
              *)in_stack_fffffffffffffdd8);
  local_128._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::end
                 ((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                   *)in_stack_fffffffffffffdd8);
  do {
    bVar1 = std::operator!=(&local_120,&local_128);
    if (!bVar1) {
      return;
    }
    local_130 = std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator*
                          ((_List_const_iterator<std::shared_ptr<ExpressionNode>_> *)
                           in_stack_fffffffffffffde0);
    peVar4 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x17b70f);
    (*(peVar4->super_Node)._vptr_Node[2])(peVar4,in_RDI);
    TypeChecker::TypeChecker((TypeChecker *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    peVar4 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x17b748);
    (*(peVar4->super_Node)._vptr_Node[2])();
    TypeChecker::getType(&local_148);
    bVar1 = std::optional<TypeName>::has_value((optional<TypeName> *)0x17b779);
    if (bVar1) {
      TypeChecker::getType(&local_148);
      std::
      _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
      ::operator->((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
                    *)0x17b7a3);
      _Var2 = std::operator!=((optional<TypeName> *)in_stack_fffffffffffffde0,
                              (TypeName *)in_stack_fffffffffffffdd8);
      if (_Var2) {
        std::
        _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
        ::operator->((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
                      *)0x17b7d4);
        std::
        unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::at((unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffde0,(key_type *)in_stack_fffffffffffffdd8);
        std::operator+(in_RDI,in_stack_fffffffffffffe20);
        std::operator+(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
        TypeChecker::getType(&local_148);
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::optional<TypeName>::value((optional<TypeName> *)in_stack_fffffffffffffde0);
        __rhs = std::
                unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::at((unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffde0,(key_type *)in_stack_fffffffffffffdd8);
        std::operator+(__lhs,__rhs);
        std::operator+(__lhs,(char *)__rhs);
        reportError(message,pNVar3);
      }
    }
    std::
    _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
    ::operator++(local_110,0);
    TypeChecker::~TypeChecker((TypeChecker *)0x17b972);
    std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator++(&local_120);
  } while( true );
}

Assistant:

void SemanticAnalyser::visit(const LambdaCallNode& node) 
{
  const auto& lambda = node.getLambda();
  const auto& expectedArguments = lambda.getArguments();
  const auto& providedArguments = node.getArguments();
  const auto nExpectedArgs = expectedArguments.size();
  const auto nProvidedArgs = providedArguments.size();

  lambda.accept(*this);

  if(nExpectedArgs != nProvidedArgs)
    reportError("Lambda expected " + std::to_string(nExpectedArgs) + 
      ", but got " + std::to_string(nProvidedArgs) + " arguments!", node);


  auto expectedArgumentIt = expectedArguments.begin();
  for(const auto& arg : providedArguments)
  {
    arg->accept(*this);

    TypeChecker typeChecker{symbols_};
    arg->accept(typeChecker);
    if(typeChecker.getType().has_value() && typeChecker.getType() != expectedArgumentIt->second)
      reportError("Lambda expected argument of type " + 
        TypeNameStrings.at(expectedArgumentIt->second) + ", but got " + 
          TypeNameStrings.at(typeChecker.getType().value()) + "!", node);

    expectedArgumentIt++;
  }
}